

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O2

void __thiscall
ktx::CommandCompare::compareLevelIndex(CommandCompare *this,PrintDiff *diff,InputStreams *streams)

{
  ktx_uint32_t kVar1;
  uint uVar2;
  pointer pKVar3;
  uint uVar4;
  _Alloc_hider _Var5;
  size_type sVar6;
  bool bVar7;
  bool bVar8;
  long lVar9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar10;
  char *pcVar11;
  InputStreams *pIVar12;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  string_view textHeaderIn;
  string_view textHeaderIn_00;
  string_view textHeaderIn_01;
  string_view jsonPathIn;
  string_view jsonPathIn_00;
  string_view jsonPathIn_01;
  char *local_168;
  undefined1 local_160;
  PrintDiff *local_150;
  _Storage<unsigned_long,_true> local_148;
  undefined1 local_140;
  string local_138;
  string local_118;
  undefined1 local_f8 [8];
  uint32_t numLevels [2];
  char *local_e8;
  InputStreams *local_e0;
  optional<ktxLevelIndexEntry> levelIndexEntry [2];
  ktxLevelIndexEntry entry;
  
  if ((this->options).super_OptionsCompare.ignoreIndex == none) {
    local_150 = diff;
    local_f8 = (undefined1  [8])this;
    local_e0 = streams;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&entry,"Level Index\n\n",(allocator<char> *)levelIndexEntry);
    PrintDiff::setContext(local_150,(string *)&entry);
    std::__cxx11::string::~string((string *)&entry);
    pKVar3 = (((vector<KTX_header2,_std::allocator<KTX_header2>_> *)((long)local_f8 + 0xf0))->
             super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>)._M_impl.
             super__Vector_impl_data._M_start;
    kVar1 = pKVar3->levelCount;
    numLevels[0] = kVar1 + (kVar1 == 0);
    uVar2 = pKVar3[1].levelCount;
    numLevels[1] = uVar2 + (uVar2 == 0);
    uVar4 = numLevels[1];
    if (uVar2 <= numLevels[0]) {
      uVar4 = numLevels[0];
    }
    local_e8 = (char *)(ulong)uVar4;
    for (pcVar11 = (char *)0x0; pcVar11 != local_e8; pcVar11 = pcVar11 + 1) {
      levelIndexEntry[0].super__Optional_base<ktxLevelIndexEntry,_true,_true>._M_payload.
      super__Optional_payload_base<ktxLevelIndexEntry>._M_engaged = false;
      levelIndexEntry[1].super__Optional_base<ktxLevelIndexEntry,_true,_true>._M_payload.
      super__Optional_payload_base<ktxLevelIndexEntry>._M_engaged = false;
      pIVar12 = local_e0;
      for (lVar9 = 3; lVar9 != 0xb; lVar9 = lVar9 + 4) {
        if (pcVar11 < (char *)(ulong)*(uint *)((long)numLevels + lVar9 + -3)) {
          read((CommandCompare *)local_f8,(int)pIVar12,(void *)((long)pcVar11 * 0x18 + 0x50),
               (size_t)&entry);
          *(ktx_uint64_t *)(numLevels + lVar9 * 2) = entry.byteOffset;
          (&local_e8)[lVar9] = (char *)entry.byteLength;
          *(ktx_uint64_t *)((long)levelIndexEntry + lVar9 * 8 + -8) = entry.uncompressedByteLength;
          if (*(char *)((long)&levelIndexEntry[0].
                               super__Optional_base<ktxLevelIndexEntry,_true,_true>._M_payload.
                               super__Optional_payload_base<ktxLevelIndexEntry>._M_payload +
                       lVar9 * 8) == '\0') {
            *(undefined1 *)
             ((long)&levelIndexEntry[0].super__Optional_base<ktxLevelIndexEntry,_true,_true>.
                     _M_payload.super__Optional_payload_base<ktxLevelIndexEntry>._M_payload +
             lVar9 * 8) = 1;
          }
        }
        pIVar12 = (InputStreams *)&pIVar12->field_0x3b8;
      }
      fmt.size_ = 2;
      fmt.data_ = (char *)0x12;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)&local_138;
      local_138._M_dataplus._M_p = pcVar11;
      ::fmt::v10::vformat_abi_cxx11_(&local_118,(v10 *)"Level{}.byteOffset",fmt,args);
      sVar6 = local_118._M_string_length;
      _Var5._M_p = local_118._M_dataplus._M_p;
      fmt_00.size_ = 2;
      fmt_00.data_ = (char *)0x1b;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)&local_168;
      local_168 = pcVar11;
      ::fmt::v10::vformat_abi_cxx11_(&local_138,(v10 *)"/index/levels/{}/byteOffset",fmt_00,args_00)
      ;
      bVar8 = levelIndexEntry[1].super__Optional_base<ktxLevelIndexEntry,_true,_true>._M_payload.
              super__Optional_payload_base<ktxLevelIndexEntry>._M_engaged;
      bVar7 = levelIndexEntry[0].super__Optional_base<ktxLevelIndexEntry,_true,_true>._M_payload.
              super__Optional_payload_base<ktxLevelIndexEntry>._M_engaged;
      local_160 = levelIndexEntry[0].super__Optional_base<ktxLevelIndexEntry,_true,_true>._M_payload
                  .super__Optional_payload_base<ktxLevelIndexEntry>._M_engaged == true;
      if ((bool)local_160) {
        local_168 = (char *)levelIndexEntry[0].super__Optional_base<ktxLevelIndexEntry,_true,_true>.
                            _M_payload.super__Optional_payload_base<ktxLevelIndexEntry>._M_payload.
                            _0_8_;
      }
      local_140 = levelIndexEntry[1].super__Optional_base<ktxLevelIndexEntry,_true,_true>._M_payload
                  .super__Optional_payload_base<ktxLevelIndexEntry>._M_engaged == true;
      if ((bool)local_140) {
        local_148 = (_Storage<unsigned_long,_true>)
                    levelIndexEntry[1].super__Optional_base<ktxLevelIndexEntry,_true,_true>.
                    _M_payload.super__Optional_payload_base<ktxLevelIndexEntry>._M_payload._0_8_;
      }
      textHeaderIn._M_str = _Var5._M_p;
      textHeaderIn._M_len = sVar6;
      jsonPathIn._M_str = local_138._M_dataplus._M_p;
      jsonPathIn._M_len = local_138._M_string_length;
      aVar10.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_168;
      DiffHex<unsigned_long>::DiffHex
                ((DiffHex<unsigned_long> *)&entry,textHeaderIn,jsonPathIn,
                 (optional<unsigned_long> *)&local_168,(optional<unsigned_long> *)&local_148);
      PrintDiff::operator<<(local_150,(DiffBase<unsigned_long> *)&entry);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_118);
      fmt_01.size_ = 2;
      fmt_01.data_ = (char *)0x12;
      args_01.field_1.values_ = aVar10.values_;
      args_01.desc_ = (unsigned_long_long)&local_138;
      local_138._M_dataplus._M_p = pcVar11;
      ::fmt::v10::vformat_abi_cxx11_(&local_118,(v10 *)"Level{}.byteLength",fmt_01,args_01);
      sVar6 = local_118._M_string_length;
      _Var5._M_p = local_118._M_dataplus._M_p;
      fmt_02.size_ = 2;
      fmt_02.data_ = (char *)0x1b;
      args_02.field_1.values_ = aVar10.values_;
      args_02.desc_ = (unsigned_long_long)&local_168;
      local_168 = pcVar11;
      ::fmt::v10::vformat_abi_cxx11_(&local_138,(v10 *)"/index/levels/{}/byteLength",fmt_02,args_02)
      ;
      local_160 = bVar7 != false;
      if ((bool)local_160) {
        local_168 = (char *)levelIndexEntry[0].super__Optional_base<ktxLevelIndexEntry,_true,_true>.
                            _M_payload.super__Optional_payload_base<ktxLevelIndexEntry>._M_payload.
                            _8_8_;
      }
      local_140 = bVar8 != false;
      if ((bool)local_140) {
        local_148 = (_Storage<unsigned_long,_true>)
                    levelIndexEntry[1].super__Optional_base<ktxLevelIndexEntry,_true,_true>.
                    _M_payload.super__Optional_payload_base<ktxLevelIndexEntry>._M_payload._8_8_;
      }
      textHeaderIn_00._M_str = _Var5._M_p;
      textHeaderIn_00._M_len = sVar6;
      jsonPathIn_00._M_str = local_138._M_dataplus._M_p;
      jsonPathIn_00._M_len = local_138._M_string_length;
      aVar10.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_168;
      Diff<unsigned_long>::Diff
                ((Diff<unsigned_long> *)&entry,textHeaderIn_00,jsonPathIn_00,
                 (optional<unsigned_long> *)&local_168,(optional<unsigned_long> *)&local_148);
      PrintDiff::operator<<(local_150,(DiffBase<unsigned_long> *)&entry);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_118);
      fmt_03.size_ = 2;
      fmt_03.data_ = (char *)0x1e;
      args_03.field_1.values_ = aVar10.values_;
      args_03.desc_ = (unsigned_long_long)&local_138;
      local_138._M_dataplus._M_p = pcVar11;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_118,(v10 *)"Level{}.uncompressedByteLength",fmt_03,args_03);
      sVar6 = local_118._M_string_length;
      _Var5._M_p = local_118._M_dataplus._M_p;
      fmt_04.size_ = 2;
      fmt_04.data_ = (char *)0x27;
      args_04.field_1.values_ = aVar10.values_;
      args_04.desc_ = (unsigned_long_long)&local_168;
      local_168 = pcVar11;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_138,(v10 *)"/index/levels/{}/uncompressedByteLength",fmt_04,args_04);
      local_160 = bVar7 != false;
      if ((bool)local_160) {
        local_168 = (char *)levelIndexEntry[0].super__Optional_base<ktxLevelIndexEntry,_true,_true>.
                            _M_payload.super__Optional_payload_base<ktxLevelIndexEntry>._M_payload.
                            _16_8_;
      }
      local_140 = bVar8 != false;
      if ((bool)local_140) {
        local_148 = (_Storage<unsigned_long,_true>)
                    levelIndexEntry[1].super__Optional_base<ktxLevelIndexEntry,_true,_true>.
                    _M_payload.super__Optional_payload_base<ktxLevelIndexEntry>._M_payload._16_8_;
      }
      textHeaderIn_01._M_str = _Var5._M_p;
      textHeaderIn_01._M_len = sVar6;
      jsonPathIn_01._M_str = local_138._M_dataplus._M_p;
      jsonPathIn_01._M_len = local_138._M_string_length;
      in_R9.values_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_168
      ;
      Diff<unsigned_long>::Diff
                ((Diff<unsigned_long> *)&entry,textHeaderIn_01,jsonPathIn_01,
                 (optional<unsigned_long> *)&local_168,(optional<unsigned_long> *)&local_148);
      PrintDiff::operator<<(local_150,(DiffBase<unsigned_long> *)&entry);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_118);
    }
  }
  return;
}

Assistant:

void CommandCompare::compareLevelIndex(PrintDiff& diff, InputStreams& streams) {
    if (options.ignoreIndex != IgnoreIndex::none) return;

    diff.setContext("Level Index\n\n");

    const uint32_t numLevels[] = {
        std::max(1u, headers[0].levelCount),
        std::max(1u, headers[1].levelCount)
    };
    const uint32_t maxNumLevels = std::max(numLevels[0], numLevels[1]);

    for (uint32_t level = 0; level < maxNumLevels; ++level) {
        const auto levelIndexEntryOffset = sizeof(KTX_header2) + level * sizeof(ktxLevelIndexEntry);
        std::optional<ktxLevelIndexEntry> levelIndexEntry[2];
        for (std::size_t i = 0; i < streams.size(); ++i)
            if (level < numLevels[i]) {
                ktxLevelIndexEntry entry;
                read(streams[i], levelIndexEntryOffset, &entry, sizeof(entry), "the level index");
                levelIndexEntry[i] = entry;
            }

        diff << DiffHex(fmt::format("Level{}.byteOffset", level),
            fmt::format("/index/levels/{}/byteOffset", level),
            OPT_FIELDS(levelIndexEntry, byteOffset));
        diff << Diff(fmt::format("Level{}.byteLength", level),
            fmt::format("/index/levels/{}/byteLength", level),
            OPT_FIELDS(levelIndexEntry, byteLength));
        diff << Diff(fmt::format("Level{}.uncompressedByteLength", level),
            fmt::format("/index/levels/{}/uncompressedByteLength", level),
            OPT_FIELDS(levelIndexEntry, uncompressedByteLength));
    }
}